

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix33<float> *A,Vec3<float> *S,Matrix33<float> *V,float tol)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  float *pfVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_18 [4];
  
  *(float *)((long)(V->x + 0) + 0) = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(undefined8 *)(V->x[0] + 2) = 0;
  *(float *)((long)(V->x + 1) + 4) = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  lVar3 = 0;
  do {
    *(float *)((long)&S->x + lVar3) = A->x[0][lVar3];
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fVar11 = 0.0;
  uVar4 = 0;
  pfVar6 = (float *)A;
  do {
    if (uVar4 < 2) {
      lVar3 = 1;
      do {
        fVar14 = ABS(pfVar6[lVar3]);
        if (ABS(pfVar6[lVar3]) <= fVar11) {
          fVar14 = fVar11;
        }
        fVar11 = fVar14;
        lVar1 = uVar4 + lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar1 != 2);
    }
    uVar4 = uVar4 + 1;
    pfVar6 = pfVar6 + 4;
  } while (uVar4 != 3);
  fVar11 = fVar11 * tol;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    uVar5 = 0;
    while( true ) {
      local_18[0] = 0.0;
      local_18[1] = 0.0;
      local_18[2] = 0.0;
      fVar19 = A->x[0][0];
      fVar14 = A->x[0][1];
      fVar10 = A->x[1][1];
      fVar8 = fVar10 - fVar19;
      fVar15 = ABS(fVar14 + fVar14);
      fVar16 = ABS(fVar8) * tol;
      if (fVar15 <= fVar16) {
        A->x[0][1] = 0.0;
      }
      else {
        fVar8 = fVar8 / (fVar14 + fVar14);
        fVar8 = *(float *)(&DAT_0014a120 + (ulong)(fVar8 < 0.0) * 4) /
                (SQRT(fVar8 * fVar8 + 1.0) + ABS(fVar8));
        fVar12 = 1.0 / SQRT(fVar8 * fVar8 + 1.0);
        fVar14 = fVar14 * fVar8;
        fVar8 = fVar8 * fVar12;
        fVar12 = fVar8 / (fVar12 + 1.0);
        local_18[0] = 0.0 - fVar14;
        local_18[1] = fVar14 + 0.0;
        A->x[0][0] = fVar19 - fVar14;
        A->x[1][1] = fVar10 + fVar14;
        A->x[0][1] = 0.0;
        fVar14 = A->x[0][2];
        fVar10 = A->x[1][2];
        A->x[0][2] = fVar14 - (fVar12 * fVar14 + fVar10) * fVar8;
        A->x[1][2] = (fVar14 - fVar12 * fVar10) * fVar8 + fVar10;
        lVar3 = 0;
        do {
          uVar2 = *(undefined8 *)((long)V->x[0] + lVar3);
          fVar14 = (float)uVar2;
          fVar10 = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3) =
               CONCAT44((-fVar12 * fVar10 + fVar14) * fVar8 + fVar10,
                        (fVar12 * fVar14 + fVar10) * -fVar8 + fVar14);
          lVar3 = lVar3 + 0xc;
        } while (lVar3 != 0x24);
        fVar19 = A->x[0][0];
      }
      fVar14 = A->x[0][2];
      fVar10 = A->x[2][2];
      fVar8 = ABS(fVar14 + fVar14);
      fVar12 = ABS(fVar10 - fVar19) * tol;
      if (fVar8 <= fVar12) {
        A->x[0][2] = 0.0;
        local_18[2] = 0.0;
      }
      else {
        fVar9 = (fVar10 - fVar19) / (fVar14 + fVar14);
        fVar17 = *(float *)(&DAT_0014a120 + (ulong)(fVar9 < 0.0) * 4) /
                 (SQRT(fVar9 * fVar9 + 1.0) + ABS(fVar9));
        fVar9 = 1.0 / SQRT(fVar17 * fVar17 + 1.0);
        fVar14 = fVar14 * fVar17;
        fVar17 = fVar17 * fVar9;
        fVar9 = fVar17 / (fVar9 + 1.0);
        local_18[0] = local_18[0] - fVar14;
        local_18[2] = fVar14 + 0.0;
        A->x[0][0] = fVar19 - fVar14;
        A->x[2][2] = fVar10 + fVar14;
        A->x[0][2] = 0.0;
        fVar14 = A->x[0][1];
        fVar10 = A->x[1][2];
        A->x[0][1] = fVar14 - (fVar9 * fVar14 + fVar10) * fVar17;
        A->x[1][2] = (fVar14 - fVar9 * fVar10) * fVar17 + fVar10;
        lVar3 = 8;
        do {
          fVar14 = *(float *)((long)(V->x + -1) + 4 + lVar3);
          fVar10 = *(float *)((long)V->x[0] + lVar3);
          *(float *)((long)(V->x + -1) + 4 + lVar3) = (fVar9 * fVar14 + fVar10) * -fVar17 + fVar14;
          *(float *)((long)V->x[0] + lVar3) = (-fVar9 * fVar10 + fVar14) * fVar17 + fVar10;
          lVar3 = lVar3 + 0xc;
        } while (lVar3 != 0x2c);
        fVar10 = A->x[2][2];
      }
      fVar14 = A->x[1][1];
      fVar19 = A->x[1][2];
      fVar9 = fVar10 - fVar14;
      fVar17 = ABS(fVar19 + fVar19);
      fVar18 = ABS(fVar9) * tol;
      if (fVar17 <= fVar18) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar9 = fVar9 / (fVar19 + fVar19);
        fVar13 = *(float *)(&DAT_0014a120 + (ulong)(fVar9 < 0.0) * 4) /
                 (SQRT(fVar9 * fVar9 + 1.0) + ABS(fVar9));
        fVar9 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
        fVar19 = fVar19 * fVar13;
        fVar13 = fVar13 * fVar9;
        fVar9 = fVar13 / (fVar9 + 1.0);
        local_18[1] = local_18[1] - fVar19;
        local_18[2] = local_18[2] + fVar19;
        A->x[1][1] = fVar14 - fVar19;
        A->x[2][2] = fVar10 + fVar19;
        A->x[1][2] = 0.0;
        uVar2 = *(undefined8 *)(A->x[0] + 1);
        fVar14 = (float)uVar2;
        fVar10 = (float)((ulong)uVar2 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44((-fVar9 * fVar10 + fVar14) * fVar13 + fVar10,
                      (fVar9 * fVar14 + fVar10) * -fVar13 + fVar14);
        lVar3 = 4;
        do {
          uVar2 = *(undefined8 *)((long)V->x[0] + lVar3);
          fVar14 = (float)uVar2;
          fVar10 = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3) =
               CONCAT44((-fVar9 * fVar10 + fVar14) * fVar13 + fVar10,
                        (fVar9 * fVar14 + fVar10) * -fVar13 + fVar14);
          lVar3 = lVar3 + 0xc;
        } while (lVar3 != 0x28);
      }
      lVar3 = 0;
      do {
        fVar14 = *(float *)((long)local_18 + lVar3) + *(float *)((long)&S->x + lVar3);
        *(float *)((long)&S->x + lVar3) = fVar14;
        A->x[0][lVar3] = fVar14;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xc);
      if ((bool)(~(fVar16 < fVar15 || fVar12 < fVar8) & fVar17 <= fVar18)) break;
      fVar14 = 0.0;
      uVar4 = 0;
      pfVar6 = (float *)A;
      do {
        if (uVar4 < 2) {
          lVar3 = 1;
          do {
            fVar10 = ABS(pfVar6[lVar3]);
            if (ABS(pfVar6[lVar3]) <= fVar14) {
              fVar10 = fVar14;
            }
            fVar14 = fVar10;
            lVar1 = uVar4 + lVar3;
            lVar3 = lVar3 + 1;
          } while (lVar1 != 2);
        }
        uVar4 = uVar4 + 1;
        pfVar6 = pfVar6 + 4;
      } while (uVar4 != 3);
      if (fVar14 <= fVar11) {
        return;
      }
      bVar7 = 0x12 < uVar5;
      uVar5 = uVar5 + 1;
      if (bVar7) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A, Vec3<T>& S, Matrix33<T>& V, const T tol)
{
    V.makeIdentity ();
    for (int i = 0; i < 3; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to
            // the corresponding diagonal entry of A and
            // this will increase numerical errors
            Vec3<T> Z (0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed      = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed      = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for (int i = 0; i < 3; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}